

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

void __thiscall
helics::HandleManager::addHandleAtIndex
          (HandleManager *this,BasicHandleInfo *otherHandle,int32_t index)

{
  iterator *this_00;
  bool bVar1;
  size_type sVar2;
  reference pBVar3;
  ulong __n;
  
  sVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                    (&this->handles);
  if ((int)sVar2 == index) {
    addHandle(this,otherHandle);
    return;
  }
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    (index,&this->handles);
  if (bVar1) {
    __n = (ulong)index;
  }
  else {
    if (index < 1) {
      return;
    }
    __n = (ulong)(uint)index;
    std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::resize
              (&this->handles,__n + 1);
  }
  this_00 = &(this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_start;
  pBVar3 = std::
           _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
           ::operator[](this_00,__n);
  BasicHandleInfo::BasicHandleInfo(pBVar3,otherHandle);
  pBVar3 = std::
           _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
           ::operator[](this_00,__n);
  addSearchFields(this,pBVar3,index);
  return;
}

Assistant:

void HandleManager::addHandleAtIndex(const BasicHandleInfo& otherHandle, int32_t index)
{
    if (index == static_cast<int32_t>(handles.size())) {
        addHandle(otherHandle);
    } else if (isValidIndex(index, handles)) {
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    } else if (index > 0) {
        handles.resize(static_cast<size_t>(index) + 1);
        // use placement new to reconstruct new object
        new (&handles[index]) BasicHandleInfo(otherHandle);
        addSearchFields(handles[index], index);
    }
}